

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O0

Abc_Ntk_t *
Abc_NtkPowerdown(Abc_Ntk_t *pNtk,int fUseLutLib,int Percentage,int Degree,int fVerbose,
                int fVeryVerbose)

{
  int *piVar1;
  float Limit_00;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Vec_Int_t *vProbs_00;
  void *__s;
  Abc_Obj_t *pAVar6;
  Abc_Ntk_t *pAig;
  Vec_Ptr_t *p;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t *pAVar8;
  void *pvVar9;
  void *pvVar10;
  char *pcVar11;
  uint *puPCEdges;
  uint local_80;
  int nTimeCris;
  int CounterRes;
  int Counter;
  int k2;
  int k;
  int i;
  float Limit;
  float *pProb;
  Abc_Obj_t *pFanin2;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vTimeFanins;
  Vec_Ptr_t *vTimeCries;
  Vec_Int_t *vProbs;
  Abc_Ntk_t *pNtkNew;
  int fVeryVerbose_local;
  int fVerbose_local;
  int Degree_local;
  int Percentage_local;
  int fUseLutLib_local;
  Abc_Ntk_t *pNtk_local;
  
  Limit_00 = 0.5 - ((float)Percentage * 1.0) / 100.0;
  vProbs_00 = Abc_NtkPowerEstimate(pNtk,0);
  piVar1 = vProbs_00->pArray;
  if (fVerbose != 0) {
    Abc_NtkPowerPrint(pNtk,vProbs_00);
  }
  iVar2 = Abc_NtkObjNumMax(pNtk);
  __s = malloc((long)iVar2 << 2);
  iVar2 = Abc_NtkObjNumMax(pNtk);
  memset(__s,0,(long)iVar2 << 2);
  for (k2 = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), k2 < iVar2; k2 = k2 + 1) {
    pAVar6 = Abc_NtkObj(pNtk,k2);
    if (((pAVar6 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pAVar6), iVar2 != 0)) &&
       (Limit_00 <= (float)piVar1[pAVar6->Id])) {
      uVar5 = Abc_NtkPowerCriticalEdges(pNtk,pAVar6,Limit_00,vProbs_00);
      *(uint *)((long)__s + (long)pAVar6->Id * 4) = uVar5;
    }
  }
  pAig = Abc_NtkStrash(pNtk,0,1,0);
  local_80 = 0;
  nTimeCris = 0;
  p = Vec_PtrAlloc(0x10);
  p_00 = Vec_PtrAlloc(0x10);
  for (k2 = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), k2 < iVar2; k2 = k2 + 1) {
    pAVar6 = Abc_NtkObj(pNtk,k2);
    if ((pAVar6 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pAVar6), iVar2 != 0)) {
      puPCEdges._4_4_ = 0;
      for (Counter = 0; iVar2 = Abc_ObjFaninNum(pAVar6), Counter < iVar2; Counter = Counter + 1) {
        pAVar7 = Abc_ObjFanin(pAVar6,Counter);
        iVar2 = Abc_ObjIsCi(pAVar7);
        if ((iVar2 == 0) &&
           ((*(uint *)((long)__s + (long)pAVar6->Id * 4) & 1 << ((byte)Counter & 0x1f)) != 0)) {
          puPCEdges._4_4_ = puPCEdges._4_4_ + 1;
        }
      }
      if ((fVeryVerbose != 0) || (puPCEdges._4_4_ != 0)) {
        nTimeCris = nTimeCris + 1;
        Vec_PtrClear(p);
        if (puPCEdges._4_4_ != 0) {
          for (Counter = 0; iVar2 = Abc_ObjFaninNum(pAVar6), Counter < iVar2; Counter = Counter + 1)
          {
            pAVar7 = Abc_ObjFanin(pAVar6,Counter);
            iVar2 = Abc_ObjIsCi(pAVar7);
            if ((iVar2 == 0) &&
               ((*(uint *)((long)__s + (long)pAVar6->Id * 4) & 1 << ((byte)Counter & 0x1f)) != 0)) {
              for (CounterRes = 0; iVar2 = Abc_ObjFaninNum(pAVar7), CounterRes < iVar2;
                  CounterRes = CounterRes + 1) {
                pAVar8 = Abc_ObjFanin(pAVar7,CounterRes);
                if ((*(uint *)((long)__s + (long)pAVar7->Id * 4) & 1 << ((byte)CounterRes & 0x1f))
                    != 0) {
                  Vec_PtrPushUnique(p,pAVar8);
                }
              }
            }
          }
        }
        iVar2 = Vec_PtrSize(p);
        if ((iVar2 != 0) && (iVar2 = Vec_PtrSize(p), iVar2 <= Degree)) {
          local_80 = local_80 + 1;
          Vec_PtrClear(p_00);
          for (Counter = 0; iVar2 = Abc_ObjFaninNum(pAVar6), Counter < iVar2; Counter = Counter + 1)
          {
            pAVar7 = Abc_ObjFanin(pAVar6,Counter);
            iVar2 = Abc_ObjIsCi(pAVar7);
            if (iVar2 == 0) {
              for (CounterRes = 0; iVar2 = Abc_ObjFaninNum(pAVar7), CounterRes < iVar2;
                  CounterRes = CounterRes + 1) {
                pAVar8 = Abc_ObjFanin(pAVar7,CounterRes);
                Vec_PtrPushUnique(p_00,pAVar8);
              }
            }
            else {
              Vec_PtrPushUnique(p_00,pAVar7);
            }
          }
          if (fVeryVerbose != 0) {
            uVar5 = pAVar6->Id;
            uVar3 = Vec_PtrSize(p);
            uVar4 = Vec_PtrSize(p_00);
            printf("%5d Node %5d : %d %2d %2d  ",(ulong)(uint)nTimeCris,(ulong)uVar5,
                   (ulong)puPCEdges._4_4_,(ulong)uVar3,(ulong)uVar4);
            for (Counter = 0; iVar2 = Abc_ObjFaninNum(pAVar6), Counter < iVar2;
                Counter = Counter + 1) {
              pAVar7 = Abc_ObjFanin(pAVar6,Counter);
              pcVar11 = "";
              if ((*(uint *)((long)__s + (long)pAVar6->Id * 4) & 1 << ((byte)Counter & 0x1f)) != 0)
              {
                pcVar11 = "*";
              }
              printf("%d(%.2f)%s ",(double)(float)piVar1[pAVar7->Id],(ulong)(uint)pAVar7->Id,pcVar11
                    );
            }
            printf("\n");
          }
          iVar2 = Vec_PtrSize(p);
          if ((iVar2 != 0) && (iVar2 = Vec_PtrSize(p), iVar2 <= Degree)) {
            iVar2 = Vec_PtrSize(p);
            if (1 < iVar2) {
              pvVar9 = Vec_PtrEntry(p,0);
              pvVar10 = Vec_PtrEntry(p,1);
              if ((float)piVar1[*(int *)((long)pvVar10 + 0x10)] <=
                  (float)piVar1[*(int *)((long)pvVar9 + 0x10)] &&
                  (float)piVar1[*(int *)((long)pvVar9 + 0x10)] !=
                  (float)piVar1[*(int *)((long)pvVar10 + 0x10)]) {
                Vec_PtrWriteEntry(p,0,pvVar10);
                Vec_PtrWriteEntry(p,1,pvVar9);
              }
            }
            iVar2 = Vec_PtrSize(p);
            if (2 < iVar2) {
              pvVar9 = Vec_PtrEntry(p,1);
              pvVar10 = Vec_PtrEntry(p,2);
              if ((float)piVar1[*(int *)((long)pvVar10 + 0x10)] <=
                  (float)piVar1[*(int *)((long)pvVar9 + 0x10)] &&
                  (float)piVar1[*(int *)((long)pvVar9 + 0x10)] !=
                  (float)piVar1[*(int *)((long)pvVar10 + 0x10)]) {
                Vec_PtrWriteEntry(p,1,pvVar10);
                Vec_PtrWriteEntry(p,2,pvVar9);
              }
              pvVar9 = Vec_PtrEntry(p,0);
              pvVar10 = Vec_PtrEntry(p,1);
              if ((float)piVar1[*(int *)((long)pvVar10 + 0x10)] <=
                  (float)piVar1[*(int *)((long)pvVar9 + 0x10)] &&
                  (float)piVar1[*(int *)((long)pvVar9 + 0x10)] !=
                  (float)piVar1[*(int *)((long)pvVar10 + 0x10)]) {
                Vec_PtrWriteEntry(p,0,pvVar10);
                Vec_PtrWriteEntry(p,1,pvVar9);
              }
            }
            Abc_NtkSpeedupNode(pNtk,pAig,pAVar6,p_00,p);
          }
        }
      }
    }
  }
  Vec_PtrFree(p);
  Vec_PtrFree(p_00);
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (fVerbose != 0) {
    uVar5 = Abc_NtkNodeNum(pNtk);
    printf("Nodes: Total = %7d. Power-critical = %7d. Workable = %7d. Ratio = %4.2f\n",
           ((double)(int)local_80 * 1.0) / (double)nTimeCris,(ulong)uVar5,(ulong)(uint)nTimeCris,
           (ulong)local_80);
  }
  for (k2 = 0; iVar2 = Vec_PtrSize(pAig->vObjs), k2 < iVar2; k2 = k2 + 1) {
    pAVar6 = Abc_NtkObj(pAig,k2);
    if (((pAVar6 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_AigNodeIsAnd(pAVar6), iVar2 != 0)) &&
       (((pAVar6->field_5).pData != (void *)0x0 &&
        (iVar2 = Abc_ObjFanoutNum((Abc_Obj_t *)(pAVar6->field_5).pData), 0 < iVar2)))) {
      (pAVar6->field_5).pData = (void *)0x0;
    }
  }
  Vec_IntFree(vProbs_00);
  return pAig;
}

Assistant:

Abc_Ntk_t * Abc_NtkPowerdown( Abc_Ntk_t * pNtk, int fUseLutLib, int Percentage, int Degree, int fVerbose, int fVeryVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Vec_Int_t * vProbs;
    Vec_Ptr_t * vTimeCries, * vTimeFanins;
    Abc_Obj_t * pNode, * pFanin, * pFanin2;
    float * pProb, Limit;
    int i, k, k2, Counter, CounterRes, nTimeCris;
    unsigned * puPCEdges;
    // compute the limit
    Limit = 0.5 - (1.0 * Percentage / 100);
    // perform computation of switching probability
    vProbs = Abc_NtkPowerEstimate( pNtk, 0 );
    pProb = (float *)vProbs->pArray;
    // compute percentage of wires of each type
    if ( fVerbose )
        Abc_NtkPowerPrint( pNtk, vProbs );
    // mark the power critical nodes and edges
    puPCEdges = ABC_ALLOC( unsigned, Abc_NtkObjNumMax(pNtk) );
    memset( puPCEdges, 0, sizeof(unsigned) * Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( pProb[pNode->Id] < Limit )
            continue;
        puPCEdges[pNode->Id] = Abc_NtkPowerCriticalEdges( pNtk, pNode, Limit, vProbs );
    }
/*
    if ( fVerbose )
    {
        Counter = CounterRes = 0;
        Abc_NtkForEachNode( pNtk, pNode, i )
        {
            Counter += Abc_ObjFaninNum(pNode);
            CounterRes += Extra_WordCountOnes( puPCEdges[pNode->Id] );
        }
        printf( "Edges: Total = %7d. Critical = %7d. Ratio = %4.2f\n", 
            Counter, CounterRes, 1.0*CounterRes/Counter );
    }
*/
    // start the resulting network
    pNtkNew = Abc_NtkStrash( pNtk, 0, 1, 0 );

    // collect nodes to be used for resynthesis
    Counter = CounterRes = 0;
    vTimeCries = Vec_PtrAlloc( 16 );
    vTimeFanins = Vec_PtrAlloc( 16 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
//        if ( pProb[pNode->Id] < Limit )
//            continue;
        // count the number of non-PI power-critical nodes
        nTimeCris = 0;
        Abc_ObjForEachFanin( pNode, pFanin, k )
            if ( !Abc_ObjIsCi(pFanin) && (puPCEdges[pNode->Id] & (1<<k)) )
                nTimeCris++;
        if ( !fVeryVerbose && nTimeCris == 0 )
            continue;
        Counter++;
        // count the total number of power-critical second-generation nodes
        Vec_PtrClear( vTimeCries );
        if ( nTimeCris )
        {
            Abc_ObjForEachFanin( pNode, pFanin, k )
                if ( !Abc_ObjIsCi(pFanin) && (puPCEdges[pNode->Id] & (1<<k)) )
                    Abc_ObjForEachFanin( pFanin, pFanin2, k2 )
                        if ( puPCEdges[pFanin->Id] & (1<<k2) )
                            Vec_PtrPushUnique( vTimeCries, pFanin2 );
        }
//        if ( !fVeryVerbose && (Vec_PtrSize(vTimeCries) == 0 || Vec_PtrSize(vTimeCries) > Degree) )
        if ( (Vec_PtrSize(vTimeCries) == 0 || Vec_PtrSize(vTimeCries) > Degree) )
            continue;
        CounterRes++;
        // collect second generation nodes
        Vec_PtrClear( vTimeFanins );
        Abc_ObjForEachFanin( pNode, pFanin, k )
        {
            if ( Abc_ObjIsCi(pFanin) )
                Vec_PtrPushUnique( vTimeFanins, pFanin );
            else
                Abc_ObjForEachFanin( pFanin, pFanin2, k2 )
                    Vec_PtrPushUnique( vTimeFanins, pFanin2 );                    
        }
        // print the results
        if ( fVeryVerbose )
        {
        printf( "%5d Node %5d : %d %2d %2d  ", Counter, pNode->Id, 
            nTimeCris, Vec_PtrSize(vTimeCries), Vec_PtrSize(vTimeFanins) );
        Abc_ObjForEachFanin( pNode, pFanin, k )
            printf( "%d(%.2f)%s ", pFanin->Id, pProb[pFanin->Id], (puPCEdges[pNode->Id] & (1<<k))? "*":"" );
        printf( "\n" );
        }
        // add the node to choices
        if ( Vec_PtrSize(vTimeCries) == 0 || Vec_PtrSize(vTimeCries) > Degree )
            continue;
        // order the fanins in the increasing order of criticalily
        if ( Vec_PtrSize(vTimeCries) > 1 )
        {
            pFanin = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 0 );
            pFanin2 = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 1 );
//            if ( Abc_ObjSlack(pFanin) < Abc_ObjSlack(pFanin2) )
            if ( pProb[pFanin->Id] > pProb[pFanin2->Id] )
            {
                Vec_PtrWriteEntry( vTimeCries, 0, pFanin2 );
                Vec_PtrWriteEntry( vTimeCries, 1, pFanin );
            }
        }
        if ( Vec_PtrSize(vTimeCries) > 2 )
        {
            pFanin = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 1 );
            pFanin2 = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 2 );
//            if ( Abc_ObjSlack(pFanin) < Abc_ObjSlack(pFanin2) )
            if ( pProb[pFanin->Id] > pProb[pFanin2->Id] )
            {
                Vec_PtrWriteEntry( vTimeCries, 1, pFanin2 );
                Vec_PtrWriteEntry( vTimeCries, 2, pFanin );
            }
            pFanin = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 0 );
            pFanin2 = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 1 );
//            if ( Abc_ObjSlack(pFanin) < Abc_ObjSlack(pFanin2) )
            if ( pProb[pFanin->Id] > pProb[pFanin2->Id] )
            {
                Vec_PtrWriteEntry( vTimeCries, 0, pFanin2 );
                Vec_PtrWriteEntry( vTimeCries, 1, pFanin );
            }
        }
        // add choice
        Abc_NtkSpeedupNode( pNtk, pNtkNew, pNode, vTimeFanins, vTimeCries );
    }
    Vec_PtrFree( vTimeCries );
    Vec_PtrFree( vTimeFanins );
    ABC_FREE( puPCEdges );
    if ( fVerbose )
        printf( "Nodes: Total = %7d. Power-critical = %7d. Workable = %7d. Ratio = %4.2f\n", 
            Abc_NtkNodeNum(pNtk), Counter, CounterRes, 1.0*CounterRes/Counter ); 

    // remove invalid choice nodes
    Abc_AigForEachAnd( pNtkNew, pNode, i )
        if ( pNode->pData )
        {
            if ( Abc_ObjFanoutNum((Abc_Obj_t *)pNode->pData) > 0 )
                pNode->pData = NULL;
        }

    // return the result
    Vec_IntFree( vProbs );
    return pNtkNew;
}